

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_kernel_2.h
# Opt level: O0

node * __thiscall
dlib::
memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
::allocate(memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
           *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long in_RDI;
  unsigned_long i;
  chunk_node *chunk;
  node *block;
  node *n;
  node *temp;
  node *in_stack_ffffffffffffffb0;
  node *this_00;
  ulong local_40;
  node *local_20;
  node *local_10;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_10 = (node *)operator_new(0x3c0);
    *(undefined8 *)&local_10->field_0x50 = 0;
    *(undefined8 *)&local_10->color = 0;
    *(undefined8 *)&local_10->field_0x40 = 0;
    *(undefined8 *)&local_10->field_0x48 = 0;
    *(undefined8 *)&local_10->field_0x30 = 0;
    *(undefined8 *)&local_10->r = 0;
    *(undefined8 *)&local_10->field_0x20 = 0;
    *(undefined8 *)&local_10->field_0x28 = 0;
    local_10->parent = (node *)0x0;
    *(undefined8 *)&local_10->d = 0;
    local_10->left = (node *)0x0;
    local_10->right = (node *)0x0;
    binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::node::node(in_stack_ffffffffffffffb0);
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = local_10;
    puVar2[1] = *(undefined8 *)(in_RDI + 0x18);
    *(undefined8 **)(in_RDI + 0x18) = puVar2;
    local_20 = local_10;
    for (local_40 = 0; local_20 = local_20 + 1, local_40 < 9; local_40 = local_40 + 1) {
      local_20->left = *(node **)(in_RDI + 0x10);
      *(node **)(in_RDI + 0x10) = local_20;
    }
  }
  else {
    local_10 = *(node **)(in_RDI + 0x10);
    uVar1 = **(undefined8 **)(in_RDI + 0x10);
    this_00 = local_10;
    memset(local_10,0,0x60);
    binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::node::node(this_00);
    *(undefined8 *)(in_RDI + 0x10) = uVar1;
  }
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  return local_10;
}

Assistant:

T* allocate (
        ) 
        {              
            T* temp = 0;
            if (next != 0)
            {
                temp = reinterpret_cast<T*>(next);
                node* n = next->next;

                try
                {
                    // construct this new T object with placement new.
                    new (static_cast<void*>(temp))T();
                }
                catch (...)
                {
                    next->next = n;
                    throw;
                }

                next = n;
            }
            else
            {
                // the linked list is empty so we need to allocate some more memory
                node* block = 0;
                block = static_cast<node*>(::operator new (sizeof(node)*chunk_size));

                // the first part of this block can be our new object
                temp = reinterpret_cast<T*>(block);

                try
                {
                    // construct this new T object with placement new.
                    new (static_cast<void*>(temp))T();
                }
                catch (...)
                {
                    // construction of the new object threw so delete the block of memory
                    ::operator delete ( static_cast<void*>(block));
                    throw;
                }

                // allocate a new chunk_node
                chunk_node* chunk;
                try {chunk = new chunk_node; }
                catch (...) 
                { 
                    temp->~T();
                    ::operator delete ( static_cast<void*>(block));
                    throw;
                }

                // add this block into the chunk list
                chunk->chunk = block;
                chunk->next = first_chunk;
                first_chunk = chunk;


                ++block;
                // now add the rest of the block into the linked list of free nodes.
                for (unsigned long i = 0; i < chunk_size-1; ++i)
                {
                    block->next = next;
                    next = block;
                    ++block;
                }

            }


            ++allocations;
            return temp;
        }